

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O3

void clip_image_f32_free(clip_image_f32 *img)

{
  pointer pfVar1;
  
  if (img != (clip_image_f32 *)0x0) {
    pfVar1 = (img->buf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pfVar1 != (pointer)0x0) {
      operator_delete(pfVar1,(long)(img->buf).super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pfVar1)
      ;
    }
    operator_delete(img,0x20);
    return;
  }
  return;
}

Assistant:

void clip_image_f32_free(struct clip_image_f32 * img) { if (img) delete img; }